

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.cc
# Opt level: O2

vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
* __thiscall
cpsm::str_split(vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                *__return_storage_ptr__,cpsm *this,string_ref str,char delimiter)

{
  size_type n;
  char *pcVar1;
  basic_string_ref<char,_std::char_traits<char>_> local_48;
  basic_string_ref<char,_std::char_traits<char>_> local_38;
  
  local_48.len_ = (size_t)str.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.ptr_ = (char *)this;
  while( true ) {
    n = boost::basic_string_ref<char,_std::char_traits<char>_>::find(&local_48,(char)str.len_);
    if (n == 0xffffffffffffffff) break;
    local_38 = boost::basic_string_ref<char,_std::char_traits<char>_>::substr(&local_48,0,n);
    std::
    vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
    ::emplace_back<boost::basic_string_ref<char,std::char_traits<char>>>
              ((vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,&local_38);
    pcVar1 = (char *)(n + 1);
    if (local_48.len_ < (char *)(n + 1)) {
      pcVar1 = (char *)local_48.len_;
    }
    local_48.ptr_ = local_48.ptr_ + (long)pcVar1;
    local_48.len_ = local_48.len_ + -(long)pcVar1;
  }
  std::
  vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::string_ref> str_split(boost::string_ref str,
                                         char const delimiter) {
  std::vector<boost::string_ref> splits;
  while (true) {
    auto const dpos = str.find_first_of(delimiter);
    if (dpos == boost::string_ref::npos) {
      break;
    }
    splits.push_back(str.substr(0, dpos));
    str.remove_prefix(dpos+1);
  }
  splits.push_back(str);
  return splits;
}